

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setControlHessianSparsity
          (QuadraticCost *this,SparsityStructure *controlSparsity)

{
  bool bVar1;
  
  bVar1 = SparsityStructure::isValid(controlSparsity);
  if (bVar1) {
    (this->super_QuadraticLikeCost).m_hasSecondPartialDerivativeWRTControlSparsity = true;
    SparsityStructure::operator=
              (&(this->super_QuadraticLikeCost).m_secondPartialDerivativeWRTControlSparsity,
               controlSparsity);
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setControlHessianSparsity",
               "The sparsity vectors have different number of entries.");
  }
  return bVar1;
}

Assistant:

bool QuadraticCost::setControlHessianSparsity(const SparsityStructure &controlSparsity)
        {
            if (!controlSparsity.isValid()) {
                reportError("QuadraticCost", "setControlHessianSparsity", "The sparsity vectors have different number of entries.");
                return false;
            }
            m_hasSecondPartialDerivativeWRTControlSparsity = true;
            m_secondPartialDerivativeWRTControlSparsity = controlSparsity;
            return true;
        }